

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::PrimToPrimSpecImpl<tinyusdz::Model>(Model *p,PrimSpec *ps,string *err)

{
  Specifier SVar1;
  string *this;
  Specifier *pSVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *this_00;
  PrimMeta *this_01;
  string *err_local;
  PrimSpec *ps_local;
  Model *p_local;
  
  this = PrimSpec::name_abi_cxx11_(ps);
  ::std::__cxx11::string::operator=((string *)this,(string *)&p->name);
  SVar1 = p->spec;
  pSVar2 = PrimSpec::specifier(ps);
  *pSVar2 = SVar1;
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             *)PrimSpec::props_abi_cxx11_(ps);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  ::operator=(this_00,&p->props);
  this_01 = PrimSpec::metas(ps);
  PrimMetas::operator=(this_01,&p->meta);
  return true;
}

Assistant:

bool PrimToPrimSpecImpl(const Model &p, PrimSpec &ps, std::string *err) {
  (void)err;

  ps.name() = p.name;
  ps.specifier() = p.spec;

  ps.props() = p.props;
  ps.metas() = p.meta;

  // TODO: variantSet
  // ps.variantSets

  return true;
}